

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntAutoPtr<Diligent::DearchiverVkImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::DearchiverVkImpl> *this,DearchiverVkImpl *pObj)

{
  this->m_pObject = pObj;
  if (pObj != (DearchiverVkImpl *)0x0) {
    RefCountedObject<Diligent::IDearchiver>::AddRef((RefCountedObject<Diligent::IDearchiver> *)pObj)
    ;
  }
  return;
}

Assistant:

explicit RefCntAutoPtr(T* pObj) noexcept :
        m_pObject{pObj}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }